

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

void __thiscall
wabt::Decompiler::BracketIfNeeded(Decompiler *this,Value *val,Precedence parent_precedence)

{
  string_view postfix;
  string_view prefix;
  Value local_30;
  
  if (((int)val->precedence <= (int)parent_precedence) &&
     ((parent_precedence & ~Assign) != Add || val->precedence != parent_precedence)) {
    postfix.size_ = 1;
    postfix.data_ = ")";
    prefix.size_ = 1;
    prefix.data_ = "(";
    WrapChild(&local_30,this,val,prefix,postfix,Atomic);
    Value::operator=(val,&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30.v);
  }
  return;
}

Assistant:

void BracketIfNeeded(Value &val, Precedence parent_precedence) {
    if (parent_precedence < val.precedence ||
        (parent_precedence == val.precedence &&
         Associative(parent_precedence))) return;
    val = WrapChild(val, "(", ")", Precedence::Atomic);
  }